

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O1

ssize_t __thiscall QRingBuffer::read(QRingBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  QRingChunk *pQVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  char *pcVar3;
  ssize_t sVar4;
  void *__ptr;
  
  if ((long)this->bufferSize < (long)__buf) {
    __buf = (void *)this->bufferSize;
  }
  if ((long)__buf < 1) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    do {
      if (this->bufferSize == 0) {
        pvVar2 = (void *)0x0;
      }
      else {
        pQVar1 = (this->buffers).d.ptr;
        pvVar2 = (void *)(pQVar1->tailOffset - pQVar1->headOffset);
      }
      __ptr = (void *)((long)__buf - sVar4);
      if ((long)pvVar2 <= (long)__buf - sVar4) {
        __ptr = pvVar2;
      }
      if (CONCAT44(in_register_00000034,__fd) != 0) {
        pQVar1 = (this->buffers).d.ptr;
        pcVar3 = (pQVar1->chunk).d.ptr;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "";
        }
        memcpy((void *)(CONCAT44(in_register_00000034,__fd) + sVar4),pcVar3 + pQVar1->headOffset,
               (size_t)__ptr);
      }
      sVar4 = sVar4 + (long)__ptr;
      free(this,__ptr);
    } while (sVar4 < (long)__buf);
  }
  return sVar4;
}

Assistant:

qint64 QRingBuffer::read(char *data, qint64 maxLength)
{
    const qint64 bytesToRead = qMin(size(), maxLength);
    qint64 readSoFar = 0;
    while (readSoFar < bytesToRead) {
        const qint64 bytesToReadFromThisBlock = qMin(bytesToRead - readSoFar,
                                                     nextDataBlockSize());
        if (data)
            memcpy(data + readSoFar, readPointer(), bytesToReadFromThisBlock);
        readSoFar += bytesToReadFromThisBlock;
        free(bytesToReadFromThisBlock);
    }
    return readSoFar;
}